

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_or_reference.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  CAR myCar;
  string asStack_68 [32];
  CAR local_48;
  CAR local_28;
  
  std::__cxx11::string::string(asStack_68,"blue",(allocator *)&local_28);
  std::__cxx11::string::string((string *)&local_48,asStack_68);
  setRed(&local_28,&local_48);
  std::__cxx11::string::operator=(asStack_68,(string *)&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"myCar color : ");
  poVar1 = std::operator<<(poVar1,asStack_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_68);
  return 0;
}

Assistant:

int main()
{
    CAR myCar = { "blue" };
    myCar = setRed(myCar);
    std::cout << "myCar color : " << myCar.color << std::endl;

    return 0;
}